

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O3

bool dxil_spv::emit_raw_buffer_store_instruction(Impl *impl,CallInst *instruction)

{
  CallInst *pCVar1;
  bool bVar2;
  Id IVar3;
  TypeID TVar4;
  uint uVar5;
  Value *pVVar6;
  CallInst *pCVar7;
  mapped_type *pmVar8;
  Type *this;
  LoggingCallback p_Var9;
  void *pvVar10;
  Id ptr_id;
  char buffer [4096];
  Id local_102c;
  char local_1028 [4096];
  
  pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  IVar3 = Converter::Impl::get_id_for_value(impl,pVVar6,0);
  local_102c = IVar3;
  if (((impl->ags).num_instructions == 2) &&
     (pCVar1 = (impl->ags).backdoor_instructions[0],
     pCVar7 = (CallInst *)LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2),
     pCVar1 == pCVar7)) {
    (impl->ags).active_uav_ptr = IVar3;
    (impl->ags).active_uav_op = BufferStore;
    bVar2 = true;
  }
  else {
    pmVar8 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&impl->handle_to_resource_meta,&local_102c);
    if (pmVar8->storage == StorageClassPhysicalStorageBuffer) {
      bVar2 = emit_physical_buffer_store_instruction
                        (impl,instruction,&pmVar8->physical_pointer_meta,0);
    }
    else {
      pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,4);
      this = LLVMBC::Value::getType(pVVar6);
      TVar4 = LLVMBC::Type::getTypeID(this);
      if ((TVar4 == FloatTyID) ||
         (((TVar4 = LLVMBC::Type::getTypeID(this), TVar4 == IntegerTyID &&
           (uVar5 = LLVMBC::Type::getIntegerBitWidth(this), uVar5 == 0x20)) ||
          (pmVar8->storage == StorageClassStorageBuffer)))) {
        bVar2 = emit_buffer_store_instruction(impl,instruction);
      }
      else {
        p_Var9 = get_thread_log_callback();
        if (p_Var9 == (LoggingCallback)0x0) {
          emit_raw_buffer_store_instruction();
        }
        else {
          memcpy(local_1028,
                 "16 or 64-bit RawBufferStore on descriptors is only supported for SSBOs.\n",0x49);
          pvVar10 = get_thread_log_callback_userdata();
          (*p_Var9)(pvVar10,Error,local_1028);
        }
        bVar2 = false;
      }
    }
  }
  return bVar2;
}

Assistant:

bool emit_raw_buffer_store_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	spv::Id ptr_id = impl.get_id_for_value(instruction->getOperand(1));

	// Deferred 64-bit atomic. Resolve in a later AGS atomic.
	if (impl.ags.num_instructions == 2 && impl.ags.backdoor_instructions[0] == instruction->getOperand(2))
	{
		impl.ags.active_uav_ptr = ptr_id;
		impl.ags.active_uav_op = DXIL::Op::BufferStore;
		return true;
	}

	const auto &meta = impl.handle_to_resource_meta[ptr_id];

	if (meta.storage != spv::StorageClassPhysicalStorageBuffer)
	{
		auto *store_type = instruction->getOperand(4)->getType();
		if (store_type->getTypeID() != llvm::Type::TypeID::FloatTyID &&
		    !(store_type->getTypeID() == llvm::Type::TypeID::IntegerTyID && store_type->getIntegerBitWidth() == 32) &&
		    meta.storage != spv::StorageClassStorageBuffer)
		{
			LOGE("16 or 64-bit RawBufferStore on descriptors is only supported for SSBOs.\n");
			return false;
		}

		return emit_buffer_store_instruction(impl, instruction);
	}
	else
		return emit_physical_buffer_store_instruction(impl, instruction, meta.physical_pointer_meta);
}